

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O0

void __thiscall TPZTensor<double>::dJ3(TPZTensor<double> *this,TPZTensor<double> *deriv)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double *pdVar28;
  long in_RSI;
  long in_RDI;
  double state5;
  double statex4;
  double state4;
  double state3;
  double statex2;
  double state2;
  double statex1;
  double state1;
  double state0;
  
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),0);
  dVar1 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),1);
  dVar2 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),1);
  dVar3 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),2);
  dVar4 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),2);
  dVar5 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),3);
  dVar6 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),4);
  dVar7 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),4);
  dVar8 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),5);
  dVar9 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),0);
  dVar10 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),0);
  dVar11 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),1);
  dVar12 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),1);
  dVar13 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),2);
  dVar14 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),2);
  dVar15 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),0);
  dVar16 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),3);
  dVar17 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),3);
  dVar18 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),3);
  dVar19 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),4);
  dVar20 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),4);
  dVar21 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),0);
  dVar22 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),5);
  dVar23 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),3);
  dVar24 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),5);
  dVar25 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),5);
  dVar26 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),5);
  dVar27 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RSI + 8),0);
  *pdVar28 = (((((((dVar10 * dVar11 * 2.0) / 9.0 + (dVar12 * dVar13) / 3.0 + (dVar14 * dVar15) / 3.0
                  ) - (dVar16 * dVar17 * 2.0) / 9.0) - (dVar18 * dVar19) / 9.0) -
               (dVar20 * dVar21 * 2.0) / 3.0) - (dVar22 * dVar23 * 2.0) / 9.0) +
             (dVar24 * dVar25 * 4.0) / 9.0) - (dVar26 * dVar27) / 9.0;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RSI + 8),1);
  *pdVar28 = dVar4 * dVar8 +
             dVar7 * dVar5 +
             (((((dVar1 * dVar2) / 3.0 + (dVar2 * dVar6) / 3.0) - (dVar2 * dVar9 * 2.0) / 3.0) +
               (dVar1 * dVar3) / 3.0 + (dVar6 * dVar3) / 3.0) - (dVar9 * dVar3 * 2.0) / 3.0);
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RSI + 8),2);
  *pdVar28 = dVar3 * dVar8 +
             ((dVar2 * dVar7 + ((dVar1 * dVar4) / 3.0 - (dVar4 * dVar6 * 2.0) / 3.0) +
               (dVar4 * dVar9) / 3.0 + (dVar1 * dVar5) / 3.0) - (dVar6 * dVar5 * 2.0) / 3.0) +
             (dVar9 * dVar5) / 3.0;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),0);
  dVar10 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),0);
  dVar11 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),1);
  dVar12 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),1);
  dVar13 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),2);
  dVar14 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),2);
  dVar15 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),0);
  dVar16 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),3);
  dVar17 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),3);
  dVar18 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),3);
  dVar19 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),4);
  dVar20 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),4);
  dVar21 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),0);
  dVar22 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),5);
  dVar23 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),3);
  dVar24 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),5);
  dVar25 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),5);
  dVar26 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),5);
  dVar27 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RSI + 8),3);
  *pdVar28 = (((((-(dVar10 * dVar11) / 9.0 + (dVar12 * dVar13) / 3.0) -
                (dVar14 * dVar15 * 2.0) / 3.0) - (dVar16 * dVar17 * 2.0) / 9.0) +
               (dVar18 * dVar19 * 2.0) / 9.0 + (dVar20 * dVar21) / 3.0 +
              (dVar22 * dVar23 * 4.0) / 9.0) - (dVar24 * dVar25 * 2.0) / 9.0) -
             (dVar26 * dVar27) / 9.0;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RSI + 8),4);
  *pdVar28 = ((dVar2 * dVar5 +
              dVar4 * dVar3 +
              (dVar1 * dVar7 * -2.0) / 3.0 + (dVar6 * dVar7) / 3.0 + (dVar7 * dVar9) / 3.0) -
             (dVar1 * dVar8 * 2.0) / 3.0) + (dVar6 * dVar8) / 3.0 + (dVar9 * dVar8) / 3.0;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),0);
  dVar1 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),0);
  dVar2 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),1);
  dVar3 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),1);
  dVar4 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),2);
  dVar5 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),2);
  dVar6 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),0);
  dVar7 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),3);
  dVar8 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),3);
  dVar9 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),3);
  dVar10 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),4);
  dVar11 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),4);
  dVar12 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),0);
  dVar13 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),5);
  dVar14 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),3);
  dVar15 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),5);
  dVar16 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),5);
  dVar17 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 8),5);
  dVar18 = *pdVar28;
  pdVar28 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RSI + 8),5);
  *pdVar28 = ((((((-(dVar1 * dVar2) / 9.0 - (dVar3 * dVar4 * 2.0) / 3.0) + (dVar5 * dVar6) / 3.0 +
                 (dVar7 * dVar8 * 4.0) / 9.0) - (dVar9 * dVar10) / 9.0) + (dVar11 * dVar12) / 3.0) -
              (dVar13 * dVar14 * 2.0) / 9.0) - (dVar15 * dVar16 * 2.0) / 9.0) +
             (dVar17 * dVar18 * 2.0) / 9.0;
  return;
}

Assistant:

void TPZTensor<T>::dJ3(TPZTensor<T> &deriv) const {
    T state0(fData[_XX_]), state1(fData[_XY_]), statex1(fData[_XY_]),
            state2(fData[_XZ_]), statex2(fData[_XZ_]), state3(fData[_YY_]),
            state4(fData[_YZ_]), statex4(fData[_YZ_]), state5(fData[_ZZ_]);
    deriv.fData[_XX_] = (fData[_XX_] * fData[_XX_]*2.) / 9. + fData[_XY_] * fData[_XY_] / 3. +
            fData[_XZ_] * fData[_XZ_] / 3. - (fData[_XX_] * fData[_YY_]*2.) / 9. -
            fData[_YY_] * fData[_YY_] / 9. - (fData[_YZ_] * fData[_YZ_]*2.) / 3. - (fData[_XX_] * fData[_ZZ_]*2.) /
            9. + (fData[_YY_] * fData[_ZZ_]*4.) / 9. - fData[_ZZ_] * fData[_ZZ_] / 9.;
    deriv.fData[_XY_] = (state0 * state1) / 3. + (state1 * state3) / 3. -
            (state1 * state5 * 2.) / 3. + (state0 * statex1) / 3. +
            (state3 * statex1) / 3. - (state5 * statex1 * 2.) / 3. +
            state4 * statex2 + state2*statex4;
    deriv.fData[_XZ_] = (state0 * state2) / 3. - (state2 * state3 * 2.) / 3. +
            state1 * state4 + (state2 * state5) / 3. +
            (state0 * statex2) / 3. - (state3 * statex2 * 2.) / 3. +
            (state5 * statex2) / 3. + statex1*statex4;
    deriv.fData[_YY_] = -(fData[_XX_] * fData[_XX_]) / 9. +
            (fData[_XY_] * fData[_XY_]) / 3. - ((fData[_XZ_] * fData[_XZ_])*2.) / 3. - (fData[_XX_] * fData[_YY_]*2.) / 9. + ((fData[_YY_] * fData[_YY_])*2.) / 9. +
            (fData[_YZ_] * fData[_YZ_]) / 3. + (fData[_XX_] * fData[_ZZ_]*4.) / 9. - (fData[_YY_] * fData[_ZZ_]*2.) / 9. -
            (fData[_ZZ_] * fData[_ZZ_]) / 9.;
    deriv.fData[_YZ_] = (state0 * state4 * (-2.)) / 3. + (state3 * state4) / 3. +
            (state4 * state5) / 3. + state2 * statex1 +
            state1 * statex2 - (state0 * statex4 * 2.) / 3. +
            (state3 * statex4) / 3. + (state5 * statex4) / 3.;
    deriv.fData[_ZZ_] = -(fData[_XX_] * fData[_XX_]) / 9. - (2. * (fData[_XY_] * fData[_XY_])) / 3. +
            (fData[_XZ_] * fData[_XZ_]) / 3. + (fData[_XX_] * fData[_YY_]*4.) / 9. - (fData[_YY_] * fData[_YY_]) / 9. +
            (fData[_YZ_] * fData[_YZ_]) / 3. - (fData[_XX_] * fData[_ZZ_]*2.) / 9. - (fData[_YY_] * fData[_ZZ_]*2.) /
            9. + ((fData[_ZZ_] * fData[_ZZ_])*2.) / 9.;

}